

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

void bio_verify_chksum(FILE *fp,int32 byteswap,uint32 chksum)

{
  size_t sVar1;
  uint local_1c;
  uint local_18;
  uint32 file_chksum;
  uint32 chksum_local;
  int32 byteswap_local;
  FILE *fp_local;
  
  local_18 = chksum;
  file_chksum = byteswap;
  _chksum_local = fp;
  sVar1 = fread(&local_1c,4,1,(FILE *)fp);
  if (sVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x1f2,"fread(chksum) failed\n");
    exit(1);
  }
  if (file_chksum != 0) {
    local_1c = local_1c >> 0x18 | local_1c >> 8 & 0xff00 | (local_1c & 0xff00) << 8 |
               local_1c << 0x18;
  }
  if (local_1c != local_18) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x1f8,"Checksum error; file-checksum %08x, computed %08x\n",(ulong)local_1c,
            (ulong)local_18);
    exit(1);
  }
  return;
}

Assistant:

void
bio_verify_chksum(FILE * fp, int32 byteswap, uint32 chksum)
{
    uint32 file_chksum;

    if (fread(&file_chksum, sizeof(uint32), 1, fp) != 1)
        E_FATAL("fread(chksum) failed\n");
    if (byteswap)
        SWAP_INT32(&file_chksum);
    if (file_chksum != chksum)
        E_FATAL
            ("Checksum error; file-checksum %08x, computed %08x\n",
             file_chksum, chksum);
}